

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dSFMT.c
# Opt level: O2

void dsfmt_fill_array_open_close(dsfmt_t *dsfmt,double *array,int size)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  double *pdVar3;
  double *pdVar4;
  double dVar5;
  undefined8 uVar6;
  uint64_t uVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  w128_t *pwVar13;
  ulong uVar14;
  w128_t *pwVar15;
  bool bVar16;
  w128_t local_48;
  w128_t *local_38;
  
  if ((size & 1U) != 0) {
    __assert_fail("size % 2 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Waterpine[P]IMAGE/SFMT/dSFMT/dSFMT.c"
                  ,0x20b,"void dsfmt_fill_array_open_close(dsfmt_t *, double *, int)");
  }
  if (0x17d < size) {
    local_38 = dsfmt->status + 0xbf;
    local_48.u[0] = dsfmt->status[0xbf].u[0];
    local_48.u[1] = *(uint64_t *)((long)dsfmt->status + 0xbf8);
    do_recursion((w128_t *)array,dsfmt->status,dsfmt->status + 0x75,&local_48);
    pwVar15 = dsfmt->status + 0x76;
    for (lVar12 = 0; lVar12 != 0x490; lVar12 = lVar12 + 0x10) {
      do_recursion((w128_t *)((long)array + lVar12 + 0x10),pwVar15 + -0x75,pwVar15,&local_48);
      pwVar15 = pwVar15 + 1;
    }
    pwVar15 = dsfmt->status + 0x4a;
    lVar12 = 0x75;
    pwVar13 = (w128_t *)array;
    while (bVar16 = lVar12 != 0, lVar12 = lVar12 + -1, bVar16) {
      do_recursion(pwVar13 + 0x4a,pwVar15,pwVar13,&local_48);
      pwVar15 = pwVar15 + 1;
      pwVar13 = pwVar13 + 1;
    }
    uVar8 = (uint)size >> 1;
    pwVar15 = (w128_t *)array;
    for (uVar14 = 0xbf; (long)uVar14 < (long)(int)(uVar8 - 0xbf); uVar14 = uVar14 + 1) {
      do_recursion(pwVar15 + 0xbf,pwVar15,pwVar15 + 0x75,&local_48);
      pwVar15->d[0] = 2.0 - pwVar15->d[0];
      pwVar15->d[1] = 2.0 - pwVar15->d[1];
      pwVar15 = pwVar15 + 1;
    }
    uVar11 = 0;
    uVar9 = (ulong)(0x17e - uVar8);
    if ((int)(0x17e - uVar8) < 1) {
      uVar9 = uVar11;
    }
    lVar12 = (ulong)uVar8 * 0x10;
    for (; uVar9 * 0x10 != uVar11; uVar11 = uVar11 + 0x10) {
      puVar1 = (undefined8 *)((long)array + uVar11 + lVar12 + -0xbf0);
      uVar6 = puVar1[1];
      puVar2 = (undefined8 *)((long)dsfmt->status + uVar11);
      *puVar2 = *puVar1;
      puVar2[1] = uVar6;
    }
    pwVar13 = dsfmt->status + uVar9;
    for (; uVar14 < uVar8; uVar14 = uVar14 + 1) {
      do_recursion(pwVar15 + 0xbf,pwVar15,pwVar15 + 0x75,&local_48);
      uVar7 = *(uint64_t *)((long)pwVar15 + 0xbf8);
      pwVar13->u[0] = pwVar15[0xbf].u[0];
      pwVar13->u[1] = uVar7;
      pwVar15->d[0] = 2.0 - pwVar15->d[0];
      pwVar15->d[1] = 2.0 - pwVar15->d[1];
      pwVar13 = (w128_t *)(pwVar13->u + 2);
      pwVar15 = pwVar15 + 1;
    }
    for (lVar10 = -0xbf0; lVar10 != 0; lVar10 = lVar10 + 0x10) {
      pdVar3 = (double *)((long)array + lVar10 + lVar12);
      dVar5 = pdVar3[1];
      pdVar4 = (double *)((long)array + lVar10 + lVar12);
      *pdVar4 = 2.0 - *pdVar3;
      pdVar4[1] = 2.0 - dVar5;
    }
    local_38->u[0] = local_48.u[0];
    local_38->u[1] = local_48.u[1];
    return;
  }
  __assert_fail("size >= DSFMT_N64",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Waterpine[P]IMAGE/SFMT/dSFMT/dSFMT.c"
                ,0x20c,"void dsfmt_fill_array_open_close(dsfmt_t *, double *, int)");
}

Assistant:

void dsfmt_fill_array_open_close(dsfmt_t* dsfmt, double array[], int size)
{
	assert(size % 2 == 0);
	assert(size >= DSFMT_N64);
	gen_rand_array_o0c1(dsfmt, (w128_t *)array, size / 2);
}